

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_synth.cc
# Opt level: O0

int main(int argc,char **argv)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  ostream *poVar5;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_15;
  ostringstream error_message_14;
  vector<double,_std::allocator<double>_> waveform;
  ostringstream error_message_13;
  WorldSynthesis world_synthesis;
  vector<double,_std::allocator<double>_> tmp_5;
  istream *input_stream_2;
  ostringstream error_message_12;
  ifstream ifs_2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  aperiodicity;
  ostringstream error_message_11;
  vector<double,_std::allocator<double>_> tmp_4;
  istream *input_stream_1;
  ostringstream error_message_10;
  ifstream ifs_1;
  ostringstream error_message_9;
  SpectrumToSpectrum spectrum_to_spectrum;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  spectrum;
  double tmp_3;
  istream *input_stream;
  ostringstream error_message_8;
  ifstream ifs;
  vector<double,_std::allocator<double>_> f0;
  double sampling_rate_in_hz;
  int spectrum_size;
  ostringstream error_message_7;
  ostringstream error_message_6;
  int num_input_files;
  char *f0_file;
  char *aperiodicity_file;
  char *spectrum_file;
  ostringstream error_message_5;
  int tmp_2;
  int max_3;
  int min_3;
  ostringstream error_message_4;
  int tmp_1;
  int max_2;
  int min_2;
  ostringstream error_message_3;
  int tmp;
  int max_1;
  int min_1;
  ostringstream error_message_2;
  double max;
  double min;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  AperiodicityFormats aperiodicity_format;
  InputOutputFormats spectrum_format;
  PitchFormats pitch_format;
  double sampling_rate;
  int frame_shift;
  int fft_length;
  option *in_stack_ffffffffffffd948;
  vector<double,_std::allocator<double>_> *this;
  anon_class_8_1_8d211705 in_stack_ffffffffffffd950;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffd958;
  allocator *paVar6;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffd960;
  undefined7 in_stack_ffffffffffffd968;
  undefined1 in_stack_ffffffffffffd96f;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffd970;
  size_type in_stack_ffffffffffffd978;
  undefined7 in_stack_ffffffffffffd980;
  undefined1 in_stack_ffffffffffffd987;
  istream *in_stack_ffffffffffffd988;
  undefined7 in_stack_ffffffffffffd990;
  undefined1 in_stack_ffffffffffffd997;
  undefined1 *in_stack_ffffffffffffd998;
  int write_size;
  int write_point;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffd9a0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffd9b0;
  double in_stack_ffffffffffffd9f0;
  undefined7 in_stack_ffffffffffffd9f8;
  undefined1 in_stack_ffffffffffffd9ff;
  undefined8 in_stack_ffffffffffffda00;
  InputOutputFormats output_format;
  char *pcVar7;
  InputOutputFormats in_stack_ffffffffffffda08;
  int in_stack_ffffffffffffda0c;
  SpectrumToSpectrum *in_stack_ffffffffffffda10;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffda78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffda80;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffda88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffda90;
  int in_stack_ffffffffffffda98;
  undefined4 in_stack_ffffffffffffda9c;
  char *local_2560;
  byte local_24d2;
  allocator *in_stack_ffffffffffffdb38;
  string *in_stack_ffffffffffffdb40;
  byte local_248a;
  byte local_2442;
  byte local_23f2;
  bool local_23ca;
  bool local_23a2;
  allocator local_2381;
  string local_2380 [32];
  ostringstream local_2360 [383];
  allocator local_21e1;
  string local_21e0 [32];
  ostringstream local_21c0 [376];
  undefined1 local_2048 [32];
  string local_2028 [32];
  ostringstream local_2008 [376];
  WorldSynthesis local_1e90;
  double *local_1e70;
  double *local_1e60;
  double *local_1e58;
  double *local_1e50;
  double *local_1e48;
  double *local_1e38;
  double *local_1e30;
  double *local_1e28;
  double *local_1e20;
  double *local_1e10;
  double *local_1e08;
  double *local_1e00;
  undefined1 local_1df0 [24];
  char *local_1dd8;
  allocator local_1dc9;
  string local_1dc8 [32];
  ostringstream local_1da8 [376];
  char local_1c30 [551];
  allocator local_1a09;
  string local_1a08 [32];
  ostringstream local_19e8 [408];
  char *local_1850;
  allocator local_1841;
  string local_1840 [32];
  ostringstream local_1820 [376];
  char local_16a8 [527];
  allocator local_1499;
  string local_1498 [32];
  ostringstream local_1478 [376];
  SpectrumToSpectrum local_1300;
  double *local_12a0;
  double *local_1290;
  double *local_1288;
  double *local_1280;
  double *local_1278;
  double local_1270;
  double *local_1268;
  double *local_1260;
  double *local_1258;
  char *local_1248;
  int local_1240;
  allocator local_1239;
  string local_1238 [32];
  ostringstream local_1218 [376];
  char local_10a0 [520];
  vector<double,_std::allocator<double>_> local_e98;
  double local_e80;
  int local_e78;
  allocator local_e71;
  string local_e70 [32];
  ostringstream local_e50 [383];
  allocator local_cd1;
  string local_cd0 [32];
  ostringstream local_cb0 [380];
  int local_b34;
  char *local_b30;
  char *local_b28;
  char *local_b20;
  allocator local_b11;
  string local_b10 [32];
  ostringstream local_af0 [383];
  allocator local_971;
  string local_970 [32];
  int local_950;
  undefined4 local_94c;
  undefined4 local_948;
  allocator local_941;
  string local_940 [32];
  ostringstream local_920 [383];
  allocator local_7a1;
  string local_7a0 [32];
  int local_780;
  undefined4 local_77c;
  undefined4 local_778;
  allocator local_771;
  string local_770 [32];
  ostringstream local_750 [383];
  allocator local_5d1;
  string local_5d0 [32];
  int local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  allocator local_5a1;
  string local_5a0 [32];
  ostringstream local_580 [383];
  allocator local_401;
  string local_400 [32];
  undefined8 local_3e0;
  undefined8 local_3d8;
  allocator local_3c9;
  string local_3c8 [32];
  ostringstream local_3a8 [383];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [32];
  ostringstream local_1e0 [399];
  allocator local_51;
  string local_50 [32];
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  double local_20;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x400;
  local_18 = 0x50;
  local_20 = 16.0;
  local_24 = 0;
  local_28 = 0;
  local_2c = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_30 = ya_getopt_long((int)((ulong)in_stack_ffffffffffffd960._M_current >> 0x20),
                                   (char **)in_stack_ffffffffffffd958._M_current,
                                   (char *)in_stack_ffffffffffffd950.sampling_rate_in_hz,
                                   in_stack_ffffffffffffd948,(int *)0x1047fc), pcVar7 = ya_optarg,
        local_30 != -1) {
    switch(local_30) {
    case 0x41:
      local_948 = 0;
      local_94c = 3;
      in_stack_ffffffffffffdb38 = &local_971;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_970,pcVar7,in_stack_ffffffffffffdb38);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)in_stack_ffffffffffffd958._M_current,
                         (int *)in_stack_ffffffffffffd950.sampling_rate_in_hz);
      local_24d2 = 1;
      if (bVar1) {
        bVar1 = sptk::IsInRange(local_950,0,3);
        local_24d2 = bVar1 ^ 0xff;
      }
      std::__cxx11::string::~string(local_970);
      std::allocator<char>::~allocator((allocator<char> *)&local_971);
      if ((local_24d2 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_af0);
        poVar5 = std::operator<<((ostream *)local_af0,
                                 "The argument for the -A option must be an integer ");
        poVar5 = std::operator<<(poVar5,"in the range of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
        poVar5 = std::operator<<(poVar5," to ");
        std::ostream::operator<<(poVar5,3);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b10,"world_synth",&local_b11);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
        std::__cxx11::string::~string(local_b10);
        std::allocator<char>::~allocator((allocator<char> *)&local_b11);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_af0);
        return local_4;
      }
      local_2c = local_950;
      break;
    default:
      anon_unknown.dwarf_2f34::PrintUsage
                ((ostream *)CONCAT17(in_stack_ffffffffffffd997,in_stack_ffffffffffffd990));
      return 1;
    case 0x46:
      local_5a8 = 0;
      local_5ac = 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5d0,pcVar7,&local_5d1);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)in_stack_ffffffffffffd958._M_current,
                         (int *)in_stack_ffffffffffffd950.sampling_rate_in_hz);
      local_2442 = 1;
      if (bVar1) {
        bVar1 = sptk::IsInRange(local_5b0,0,2);
        local_2442 = bVar1 ^ 0xff;
      }
      std::__cxx11::string::~string(local_5d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
      if ((local_2442 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_750);
        poVar5 = std::operator<<((ostream *)local_750,
                                 "The argument for the -F option must be an integer ");
        poVar5 = std::operator<<(poVar5,"in the range of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
        poVar5 = std::operator<<(poVar5," to ");
        std::ostream::operator<<(poVar5,2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_770,"world_synth",&local_771);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
        std::__cxx11::string::~string(local_770);
        std::allocator<char>::~allocator((allocator<char> *)&local_771);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_750);
        return local_4;
      }
      local_24 = local_5b0;
      break;
    case 0x53:
      local_778 = 0;
      local_77c = 3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7a0,pcVar7,&local_7a1);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)in_stack_ffffffffffffd958._M_current,
                         (int *)in_stack_ffffffffffffd950.sampling_rate_in_hz);
      local_248a = 1;
      if (bVar1) {
        bVar1 = sptk::IsInRange(local_780,0,3);
        local_248a = bVar1 ^ 0xff;
      }
      std::__cxx11::string::~string(local_7a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
      if ((local_248a & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_920);
        poVar5 = std::operator<<((ostream *)local_920,
                                 "The argument for the -S option must be an integer ");
        poVar5 = std::operator<<(poVar5,"in the range of ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
        poVar5 = std::operator<<(poVar5," to ");
        std::ostream::operator<<(poVar5,3);
        paVar6 = &local_941;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_940,"world_synth",paVar6);
        sptk::PrintErrorMessage((string *)paVar6,(ostringstream *)in_stack_ffffffffffffdb38);
        std::__cxx11::string::~string(local_940);
        std::allocator<char>::~allocator((allocator<char> *)&local_941);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_920);
        return local_4;
      }
      local_28 = local_780;
      break;
    case 0x68:
      anon_unknown.dwarf_2f34::PrintUsage
                ((ostream *)CONCAT17(in_stack_ffffffffffffd997,in_stack_ffffffffffffd990));
      return 0;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,pcVar7,&local_51);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)in_stack_ffffffffffffd958._M_current,
                         (int *)in_stack_ffffffffffffd950.sampling_rate_in_hz);
      local_23a2 = !bVar1 || local_14 < 0x200;
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      if (local_23a2) {
        std::__cxx11::ostringstream::ostringstream(local_1e0);
        std::operator<<((ostream *)local_1e0,"The argument for the -l option must be at least 512");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_200,"world_synth",&local_201);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
        std::__cxx11::string::~string(local_200);
        std::allocator<char>::~allocator((allocator<char> *)&local_201);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1e0);
        return local_4;
      }
      break;
    case 0x70:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,pcVar7,&local_229);
      bVar1 = sptk::ConvertStringToInteger
                        ((string *)in_stack_ffffffffffffd958._M_current,
                         (int *)in_stack_ffffffffffffd950.sampling_rate_in_hz);
      local_23ca = !bVar1 || local_18 < 1;
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
      if (local_23ca) {
        std::__cxx11::ostringstream::ostringstream(local_3a8);
        std::operator<<((ostream *)local_3a8,
                        "The argument for the -p option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c8,"world_synth",&local_3c9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
        std::__cxx11::string::~string(local_3c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a8);
        return local_4;
      }
      break;
    case 0x73:
      local_3d8 = 0x4020000000000000;
      local_3e0 = 0x4058800000000000;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_400,pcVar7,&local_401);
      bVar1 = sptk::ConvertStringToDouble
                        ((string *)in_stack_ffffffffffffd958._M_current,
                         (double *)in_stack_ffffffffffffd950.sampling_rate_in_hz);
      local_23f2 = 1;
      if (bVar1) {
        bVar1 = sptk::IsInRange(local_20,8.0,98.0);
        local_23f2 = bVar1 ^ 0xff;
      }
      std::__cxx11::string::~string(local_400);
      std::allocator<char>::~allocator((allocator<char> *)&local_401);
      if ((local_23f2 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_580);
        poVar5 = std::operator<<((ostream *)local_580,
                                 "The argument for the -s option must be in a number ");
        poVar5 = std::operator<<(poVar5,"in the interval [");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,8.0);
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,98.0);
        std::operator<<(poVar5,"]");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5a0,"world_synth",&local_5a1);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
        std::__cxx11::string::~string(local_5a0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_580);
        return local_4;
      }
    }
  }
  local_b34 = local_8 - ya_optind;
  if (local_b34 == 3) {
    local_b20 = *(char **)(local_10 + (long)(local_8 + -3) * 8);
    local_b28 = *(char **)(local_10 + (long)(local_8 + -2) * 8);
    local_b30 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
  }
  else {
    if (local_b34 != 2) {
      std::__cxx11::ostringstream::ostringstream(local_cb0);
      std::operator<<((ostream *)local_cb0,
                      "Just three input files, spfile, apfile, and f0file are required");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cd0,"world_synth",&local_cd1);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
      std::__cxx11::string::~string(local_cd0);
      std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_cb0);
      return local_4;
    }
    local_b20 = *(char **)(local_10 + (long)(local_8 + -2) * 8);
    local_b28 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
    local_b30 = (char *)0x0;
  }
  bVar1 = sptk::SetBinaryMode();
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_e50);
    std::operator<<((ostream *)local_e50,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e70,"world_synth",&local_e71);
    sptk::PrintErrorMessage(in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
    std::__cxx11::string::~string(local_e70);
    std::allocator<char>::~allocator((allocator<char> *)&local_e71);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e50);
    return local_4;
  }
  local_e78 = local_14 / 2 + 1;
  local_e80 = local_20 * 1000.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x105be9);
  std::ifstream::ifstream(local_10a0);
  pcVar7 = local_b30;
  if (local_b30 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_10a0,(_Ios_Openmode)pcVar7);
    bVar2 = std::ios::fail();
    output_format = (InputOutputFormats)((ulong)in_stack_ffffffffffffda00 >> 0x20);
    if ((bVar2 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1218);
      poVar5 = std::operator<<((ostream *)local_1218,"Cannot open file ");
      std::operator<<(poVar5,local_b30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1238,"world_synth",&local_1239);
      sptk::PrintErrorMessage(in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
      std::__cxx11::string::~string(local_1238);
      std::allocator<char>::~allocator((allocator<char> *)&local_1239);
      local_4 = 1;
      local_1240 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1218);
      goto LAB_00105ff5;
    }
  }
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    local_2560 = (char *)&std::cin;
  }
  else {
    local_2560 = local_10a0;
  }
  local_1248 = local_2560;
  while( true ) {
    bVar1 = sptk::ReadStream<double>
                      (in_stack_ffffffffffffd958._M_current,
                       (istream *)in_stack_ffffffffffffd950.sampling_rate_in_hz);
    output_format = (InputOutputFormats)((ulong)in_stack_ffffffffffffda00 >> 0x20);
    in_stack_ffffffffffffda9c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffda9c);
    if (!bVar1) break;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd960._M_current,
               in_stack_ffffffffffffd958._M_current);
  }
  in_stack_ffffffffffffda98 = local_24;
  if (local_24 == 0) {
    in_stack_ffffffffffffda88 = &local_e98;
    local_1258 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd948);
    local_1260 = (double *)
                 std::vector<double,_std::allocator<double>_>::end
                           ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd948);
    local_1268 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd948);
    local_1270 = local_e80;
    __first._M_current._7_1_ = in_stack_ffffffffffffd96f;
    __first._M_current._0_7_ = in_stack_ffffffffffffd968;
    in_stack_ffffffffffffda90 =
         std::
         transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__0>
                   (__first,in_stack_ffffffffffffd960,in_stack_ffffffffffffd958,
                    in_stack_ffffffffffffd950);
    local_1278 = in_stack_ffffffffffffda90._M_current;
  }
  else if ((local_24 != 1) && (local_24 == 2)) {
    in_stack_ffffffffffffda78 = &local_e98;
    local_1280 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd948);
    local_1288 = (double *)
                 std::vector<double,_std::allocator<double>_>::end
                           ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd948);
    local_1290 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd948);
    in_stack_ffffffffffffda80 =
         std::
         transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__1>
                   (local_1280,local_1288,local_1290);
    local_12a0 = in_stack_ffffffffffffda80._M_current;
  }
  local_1240 = 0;
LAB_00105ff5:
  std::ifstream::~ifstream(local_10a0);
  if (local_1240 == 0) {
    bVar1 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_ffffffffffffd960._M_current);
    if (bVar1) {
      local_4 = 0;
      local_1240 = 1;
    }
    else {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)0x106068);
      std::vector<double,_std::allocator<double>_>::size(&local_e98);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::reserve((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
                in_stack_ffffffffffffd978);
      sptk::SpectrumToSpectrum::SpectrumToSpectrum
                (in_stack_ffffffffffffda10,in_stack_ffffffffffffda0c,in_stack_ffffffffffffda08,
                 output_format,(double)CONCAT17(in_stack_ffffffffffffd9ff,in_stack_ffffffffffffd9f8)
                 ,in_stack_ffffffffffffd9f0);
      bVar1 = sptk::SpectrumToSpectrum::IsValid(&local_1300);
      if (bVar1) {
        std::ifstream::ifstream(local_16a8);
        pcVar7 = local_b20;
        std::operator|(_S_in,_S_bin);
        std::ifstream::open(local_16a8,(_Ios_Openmode)pcVar7);
        bVar2 = std::ios::fail();
        if ((bVar2 & 1) == 0) {
          local_1850 = local_16a8;
          std::allocator<double>::allocator((allocator<double> *)0x10643b);
          std::vector<double,_std::allocator<double>_>::vector
                    (in_stack_ffffffffffffd970,
                     CONCAT17(in_stack_ffffffffffffd96f,in_stack_ffffffffffffd968),
                     (allocator_type *)in_stack_ffffffffffffd960._M_current);
          std::allocator<double>::~allocator((allocator<double> *)0x106467);
          while (bVar1 = sptk::ReadStream<double>
                                   (SUB81((ulong)in_stack_ffffffffffffd9a0._M_current >> 0x30,0),
                                    (int)in_stack_ffffffffffffd9a0._M_current,
                                    (int)((ulong)in_stack_ffffffffffffd998 >> 0x20),
                                    (int)in_stack_ffffffffffffd998,
                                    (vector<double,_std::allocator<double>_> *)
                                    CONCAT17(in_stack_ffffffffffffd997,in_stack_ffffffffffffd990),
                                    in_stack_ffffffffffffd988,
                                    (int *)in_stack_ffffffffffffd9b0._M_current), bVar1) {
            bVar1 = sptk::SpectrumToSpectrum::Run
                              ((SpectrumToSpectrum *)in_stack_ffffffffffffd958._M_current,
                               (vector<double,_std::allocator<double>_> *)
                               in_stack_ffffffffffffd950.sampling_rate_in_hz);
            if (!bVar1) {
              std::__cxx11::ostringstream::ostringstream(local_19e8);
              std::operator<<((ostream *)local_19e8,"Failed to convert spectrum");
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1a08,"world_synth",&local_1a09);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
              std::__cxx11::string::~string(local_1a08);
              std::allocator<char>::~allocator((allocator<char> *)&local_1a09);
              local_4 = 1;
              local_1240 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_19e8);
              goto LAB_0010665e;
            }
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)in_stack_ffffffffffffd960._M_current,
                        (value_type *)in_stack_ffffffffffffd958._M_current);
          }
          local_1240 = 0;
LAB_0010665e:
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd960._M_current
                    );
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_1820);
          poVar5 = std::operator<<((ostream *)local_1820,"Cannot open file ");
          std::operator<<(poVar5,local_b20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1840,"world_synth",&local_1841);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
          std::__cxx11::string::~string(local_1840);
          std::allocator<char>::~allocator((allocator<char> *)&local_1841);
          local_4 = 1;
          local_1240 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1820);
        }
        std::ifstream::~ifstream(local_16a8);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1478);
        std::operator<<((ostream *)local_1478,"FFT length must be a power of 2");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1498,"world_synth",&local_1499);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
        std::__cxx11::string::~string(local_1498);
        std::allocator<char>::~allocator((allocator<char> *)&local_1499);
        local_4 = 1;
        local_1240 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1478);
      }
      sptk::SpectrumToSpectrum::~SpectrumToSpectrum
                ((SpectrumToSpectrum *)in_stack_ffffffffffffd960._M_current);
      if (local_1240 == 0) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)0x1066ab);
        std::vector<double,_std::allocator<double>_>::size(&local_e98);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::reserve((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
                  in_stack_ffffffffffffd978);
        std::ifstream::ifstream(local_1c30);
        pcVar7 = local_b28;
        std::operator|(_S_in,_S_bin);
        std::ifstream::open(local_1c30,(_Ios_Openmode)pcVar7);
        bVar2 = std::ios::fail();
        if ((bVar2 & 1) == 0) {
          local_1dd8 = local_1c30;
          std::allocator<double>::allocator((allocator<double> *)0x106920);
          std::vector<double,_std::allocator<double>_>::vector
                    (in_stack_ffffffffffffd970,
                     CONCAT17(in_stack_ffffffffffffd96f,in_stack_ffffffffffffd968),
                     (allocator_type *)in_stack_ffffffffffffd960._M_current);
          std::allocator<double>::~allocator((allocator<double> *)0x10694c);
          while( true ) {
            this = (vector<double,_std::allocator<double>_> *)0x0;
            bVar1 = sptk::ReadStream<double>
                              (SUB81((ulong)in_stack_ffffffffffffd9a0._M_current >> 0x30,0),
                               (int)in_stack_ffffffffffffd9a0._M_current,
                               (int)((ulong)in_stack_ffffffffffffd998 >> 0x20),
                               (int)in_stack_ffffffffffffd998,
                               (vector<double,_std::allocator<double>_> *)
                               CONCAT17(in_stack_ffffffffffffd997,in_stack_ffffffffffffd990),
                               in_stack_ffffffffffffd988,(int *)in_stack_ffffffffffffd9b0._M_current
                              );
            if (!bVar1) break;
            switch(local_2c) {
            case 0:
              break;
            case 1:
              local_1e00 = (double *)std::vector<double,_std::allocator<double>_>::begin(this);
              local_1e08 = (double *)std::vector<double,_std::allocator<double>_>::end(this);
              local_1e10 = (double *)std::vector<double,_std::allocator<double>_>::begin(this);
              local_1e20 = (double *)
                           std::
                           transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__2>
                                     (local_1e00,local_1e08,local_1e10);
              break;
            case 2:
              local_1e28 = (double *)std::vector<double,_std::allocator<double>_>::begin(this);
              local_1e30 = (double *)std::vector<double,_std::allocator<double>_>::end(this);
              local_1e38 = (double *)std::vector<double,_std::allocator<double>_>::begin(this);
              in_stack_ffffffffffffd9b0 =
                   std::
                   transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__3>
                             (local_1e28,local_1e30,local_1e38);
              local_1e48 = in_stack_ffffffffffffd9b0._M_current;
              break;
            case 3:
              in_stack_ffffffffffffd998 = local_1df0;
              local_1e50 = (double *)std::vector<double,_std::allocator<double>_>::begin(this);
              local_1e58 = (double *)std::vector<double,_std::allocator<double>_>::end(this);
              local_1e60 = (double *)std::vector<double,_std::allocator<double>_>::begin(this);
              in_stack_ffffffffffffd9a0 =
                   std::
                   transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,main::__4>
                             (local_1e50,local_1e58,local_1e60);
              local_1e70 = in_stack_ffffffffffffd9a0._M_current;
            }
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)in_stack_ffffffffffffd960._M_current,
                        (value_type *)in_stack_ffffffffffffd958._M_current);
          }
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd960._M_current
                    );
          write_point = (int)in_stack_ffffffffffffd9a0._M_current;
          write_size = (int)((ulong)in_stack_ffffffffffffd998 >> 0x20);
          local_1240 = 0;
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_1da8);
          write_point = (int)in_stack_ffffffffffffd9a0._M_current;
          write_size = (int)((ulong)in_stack_ffffffffffffd998 >> 0x20);
          poVar5 = std::operator<<((ostream *)local_1da8,"Cannot open file ");
          std::operator<<(poVar5,local_b28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1dc8,"world_synth",&local_1dc9);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
          std::__cxx11::string::~string(local_1dc8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1dc9);
          local_4 = 1;
          local_1240 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1da8);
        }
        std::ifstream::~ifstream(local_1c30);
        if (local_1240 == 0) {
          sptk::WorldSynthesis::WorldSynthesis
                    ((WorldSynthesis *)in_stack_ffffffffffffd960._M_current,
                     (int)((ulong)in_stack_ffffffffffffd958._M_current >> 0x20),
                     (int)in_stack_ffffffffffffd958._M_current,
                     in_stack_ffffffffffffd950.sampling_rate_in_hz);
          uVar3 = sptk::WorldSynthesis::IsValid(&local_1e90);
          if ((bool)uVar3) {
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)0x106d58);
            uVar4 = sptk::WorldSynthesis::Run
                              ((WorldSynthesis *)
                               CONCAT44(in_stack_ffffffffffffda9c,in_stack_ffffffffffffda98),
                               (vector<double,_std::allocator<double>_> *)
                               in_stack_ffffffffffffda90._M_current,
                               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)in_stack_ffffffffffffda88,
                               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)in_stack_ffffffffffffda80._M_current,in_stack_ffffffffffffda78);
            if ((bool)uVar4) {
              in_stack_ffffffffffffd960._M_current = (double *)local_2048;
              std::vector<double,_std::allocator<double>_>::size
                        ((vector<double,_std::allocator<double>_> *)
                         in_stack_ffffffffffffd960._M_current);
              bVar1 = sptk::WriteStream<double>
                                (write_point,write_size,
                                 (vector<double,_std::allocator<double>_> *)
                                 CONCAT17(uVar3,in_stack_ffffffffffffd990),
                                 (ostream *)in_stack_ffffffffffffd988,
                                 (int *)CONCAT17(uVar4,in_stack_ffffffffffffd980));
              if (bVar1) {
                local_4 = 0;
                local_1240 = 1;
              }
              else {
                std::__cxx11::ostringstream::ostringstream(local_2360);
                std::operator<<((ostream *)local_2360,"Failed to write waveform");
                paVar6 = &local_2381;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2380,"world_synth",paVar6);
                sptk::PrintErrorMessage
                          (in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
                std::__cxx11::string::~string(local_2380);
                std::allocator<char>::~allocator((allocator<char> *)&local_2381);
                local_4 = 1;
                local_1240 = 1;
                std::__cxx11::ostringstream::~ostringstream(local_2360);
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_21c0);
              std::operator<<((ostream *)local_21c0,"Failed to synthesize waveform");
              paVar6 = &local_21e1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_21e0,"world_synth",paVar6);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
              std::__cxx11::string::~string(local_21e0);
              std::allocator<char>::~allocator((allocator<char> *)&local_21e1);
              local_4 = 1;
              local_1240 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_21c0);
            }
            std::vector<double,_std::allocator<double>_>::~vector
                      ((vector<double,_std::allocator<double>_> *)
                       in_stack_ffffffffffffd960._M_current);
          }
          else {
            std::__cxx11::ostringstream::ostringstream(local_2008);
            std::operator<<((ostream *)local_2008,"Failed to initialize WorldSynthesis");
            paVar6 = (allocator *)(local_2048 + 0x1f);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2028,"world_synth",paVar6);
            sptk::PrintErrorMessage
                      (in_stack_ffffffffffffdb40,(ostringstream *)in_stack_ffffffffffffdb38);
            std::__cxx11::string::~string(local_2028);
            std::allocator<char>::~allocator((allocator<char> *)(local_2048 + 0x1f));
            local_4 = 1;
            local_1240 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_2008);
          }
          sptk::WorldSynthesis::~WorldSynthesis(&local_1e90);
        }
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)in_stack_ffffffffffffd960._M_current);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_ffffffffffffd960._M_current);
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffd960._M_current);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  int frame_shift(kDefaultFrameShift);
  double sampling_rate(kDefaultSamplingRate);
  PitchFormats pitch_format(kDefaultPitchFormat);
  sptk::SpectrumToSpectrum::InputOutputFormats spectrum_format(
      kDefaultSpectrumFormat);
  AperiodicityFormats aperiodicity_format(kDefaultAperiodicityFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:p:s:F:S:A:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length) ||
            fft_length < 512) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be at least 512";
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_shift) ||
            frame_shift <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        const double min(8.0);
        const double max(98.0);
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            !sptk::IsInRange(sampling_rate, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be in a number "
                        << "in the interval [" << min << ", " << max << "]";
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        break;
      }
      case 'F': {
        const int min(0);
        const int max(static_cast<int>(kNumPitchFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -F option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        pitch_format = static_cast<PitchFormats>(tmp);
        break;
      }
      case 'S': {
        const int min(0);
        const int max(
            static_cast<int>(sptk::SpectrumToSpectrum::kNumInputOutputFormats) -
            1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -S option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        spectrum_format =
            static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(tmp);
        break;
      }
      case 'A': {
        const int min(0);
        const int max(static_cast<int>(kNumAperiodicityFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -A option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("world_synth", error_message);
          return 1;
        }
        aperiodicity_format = static_cast<AperiodicityFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* spectrum_file;
  const char* aperiodicity_file;
  const char* f0_file;
  const int num_input_files(argc - optind);
  if (3 == num_input_files) {
    spectrum_file = argv[argc - 3];
    aperiodicity_file = argv[argc - 2];
    f0_file = argv[argc - 1];
  } else if (2 == num_input_files) {
    spectrum_file = argv[argc - 2];
    aperiodicity_file = argv[argc - 1];
    f0_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message
        << "Just three input files, spfile, apfile, and f0file are required";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }
  const int spectrum_size(fft_length / 2 + 1);
  const double sampling_rate_in_hz(1000.0 * sampling_rate);

  std::vector<double> f0;
  {
    std::ifstream ifs;
    if (NULL != f0_file) {
      ifs.open(f0_file, std::ios::in | std::ios::binary);
      if (ifs.fail()) {
        std::ostringstream error_message;
        error_message << "Cannot open file " << f0_file;
        sptk::PrintErrorMessage("world_synth", error_message);
        return 1;
      }
    }
    std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

    double tmp;
    while (sptk::ReadStream(&tmp, &input_stream)) {
      f0.push_back(tmp);
    }

    switch (pitch_format) {
      case kPitch: {
        std::transform(f0.begin(), f0.end(), f0.begin(),
                       [sampling_rate_in_hz](double x) {
                         return (0.0 == x) ? 0.0 : sampling_rate_in_hz / x;
                       });
        break;
      }
      case kF0: {
        // nothing to do
        break;
      }
      case kLogF0: {
        std::transform(f0.begin(), f0.end(), f0.begin(), [](double x) {
          return (sptk::kLogZero == x) ? 0.0 : std::exp(x);
        });
        break;
      }
      default: {
        break;
      }
    }
  }
  if (f0.empty()) return 0;

  std::vector<std::vector<double>> spectrum;
  spectrum.reserve(f0.size());
  {
    sptk::SpectrumToSpectrum spectrum_to_spectrum(
        fft_length,
        static_cast<sptk::SpectrumToSpectrum::InputOutputFormats>(
            spectrum_format),
        sptk::SpectrumToSpectrum::InputOutputFormats::kPowerSpectrum);
    if (!spectrum_to_spectrum.IsValid()) {
      std::ostringstream error_message;
      error_message << "FFT length must be a power of 2";
      sptk::PrintErrorMessage("world_synth", error_message);
      return 1;
    }

    std::ifstream ifs;
    ifs.open(spectrum_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << spectrum_file;
      sptk::PrintErrorMessage("world_synth", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    std::vector<double> tmp(spectrum_size);
    while (sptk::ReadStream(false, 0, 0, spectrum_size, &tmp, &input_stream,
                            NULL)) {
      if (!spectrum_to_spectrum.Run(&tmp)) {
        std::ostringstream error_message;
        error_message << "Failed to convert spectrum";
        sptk::PrintErrorMessage("world_synth", error_message);
        return 1;
      }
      spectrum.push_back(tmp);
    }
  }

  std::vector<std::vector<double>> aperiodicity;
  aperiodicity.reserve(f0.size());
  {
    std::ifstream ifs;
    ifs.open(aperiodicity_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << aperiodicity_file;
      sptk::PrintErrorMessage("world_synth", error_message);
      return 1;
    }
    std::istream& input_stream(ifs);

    std::vector<double> tmp(spectrum_size);
    while (sptk::ReadStream(false, 0, 0, spectrum_size, &tmp, &input_stream,
                            NULL)) {
      switch (aperiodicity_format) {
        case kAperiodicity: {
          // nothing to do
          break;
        }
        case kPeriodicity: {
          std::transform(tmp.begin(), tmp.end(), tmp.begin(),
                         [](double p) { return 1.0 - p; });
          break;
        }
        case kAperiodicityOverPeriodicity: {
          std::transform(tmp.begin(), tmp.end(), tmp.begin(),
                         [](double ap) { return ap / (1.0 + ap); });
          break;
        }
        case kPeriodicityOverAperiodicity: {
          std::transform(tmp.begin(), tmp.end(), tmp.begin(),
                         [](double pa) { return 1.0 / (1.0 + pa); });
          break;
        }
        default: {
          break;
        }
      }
      aperiodicity.push_back(tmp);
    }
  }

  sptk::WorldSynthesis world_synthesis(fft_length, frame_shift,
                                       sampling_rate_in_hz);
  if (!world_synthesis.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize WorldSynthesis";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  std::vector<double> waveform;
  if (!world_synthesis.Run(f0, spectrum, aperiodicity, &waveform)) {
    std::ostringstream error_message;
    error_message << "Failed to synthesize waveform";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  if (!sptk::WriteStream(0, static_cast<int>(waveform.size()), waveform,
                         &std::cout, NULL)) {
    std::ostringstream error_message;
    error_message << "Failed to write waveform";
    sptk::PrintErrorMessage("world_synth", error_message);
    return 1;
  }

  return 0;
}